

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O0

void StartTorControl(CService *onion_service_target)

{
  long lVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  long in_FS_OFFSET;
  ConstevalFormatString<0U> in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  string_view in_stack_00000020;
  Level in_stack_00000100;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  CService *in_stack_ffffffffffffff60;
  CService *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  type *in_stack_ffffffffffffff88;
  char (*in_stack_ffffffffffffff90) [11];
  basic_string_view<char,_std::char_traits<char>_> *__f;
  code *this;
  LogFlags in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (gBase != (event_base *)0x0) {
    __assert_fail("!gBase",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
                  ,0x2a6,"void StartTorControl(CService)");
  }
  __f = in_RDI;
  evthread_use_pthreads();
  gBase = (event_base *)event_base_new();
  if (gBase == (event_base *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,in_stack_ffffffffffffff70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,in_stack_ffffffffffffff70);
    LogPrintFormatInternal<>
              (in_stack_00000020,(string_view)in_stack_00000010,in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc0,in_stack_00000100,in_stack_00000008);
  }
  else {
    this = util::TraceThread;
    CService::CService(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::thread::
    thread<void(*)(std::basic_string_view<char,std::char_traits<char>>,std::function<void()>),char_const(&)[11],StartTorControl(CService)::__0,void>
              ((thread *)this,
               (_func_void_basic_string_view<char,_std::char_traits<char>_>_function<void_()> **)__f
               ,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::thread::operator=((thread *)in_stack_ffffffffffffff68,(thread *)in_stack_ffffffffffffff60);
    std::thread::~thread((thread *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    StartTorControl(CService)::$_0::~__0
              ((type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StartTorControl(CService onion_service_target)
{
    assert(!gBase);
#ifdef WIN32
    evthread_use_windows_threads();
#else
    evthread_use_pthreads();
#endif
    gBase = event_base_new();
    if (!gBase) {
        LogPrintf("tor: Unable to create event_base\n");
        return;
    }

    torControlThread = std::thread(&util::TraceThread, "torcontrol", [onion_service_target] {
        TorControlThread(onion_service_target);
    });
}